

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::push_arg<asmjit::X86Gp,asmjit::X86Gp>(X86Assembler *as,X86Gp *arg1,X86Gp *args)

{
  uint32_t instId;
  undefined8 this;
  X86Gp *args_local;
  X86Gp *arg1_local;
  X86Assembler *as_local;
  
  instId = (uint32_t)((ulong)arg1 >> 0x20);
  this = (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  push_arg<asmjit::X86Gp>(as,(X86Gp *)&stack0xffffffffffffff70);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,instId,(Operand_ *)0x152c48);
  return;
}

Assistant:

static void push_arg(asmjit::X86Assembler& as, T1 arg1, Ts... args)
{
	push_arg(as, args...);
	as.push(arg1);
}